

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O0

void Aig_ObjCreateRepr(Aig_Man_t *p,Aig_Obj_t *pNode1,Aig_Obj_t *pNode2)

{
  int iVar1;
  Aig_Obj_t *pNode2_local;
  Aig_Obj_t *pNode1_local;
  Aig_Man_t *p_local;
  
  if (p->pReprs == (Aig_Obj_t **)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                  ,0x55,"void Aig_ObjCreateRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_IsComplement(pNode1);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pNode1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                  ,0x56,"void Aig_ObjCreateRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_IsComplement(pNode2);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pNode2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                  ,0x57,"void Aig_ObjCreateRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if (pNode1->Id < p->nReprsAlloc) {
    if (p->nReprsAlloc <= pNode2->Id) {
      __assert_fail("pNode2->Id < p->nReprsAlloc",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                    ,0x59,"void Aig_ObjCreateRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    if (pNode1->Id < pNode2->Id) {
      p->pReprs[pNode2->Id] = pNode1;
      return;
    }
    __assert_fail("pNode1->Id < pNode2->Id",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                  ,0x5a,"void Aig_ObjCreateRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  __assert_fail("pNode1->Id < p->nReprsAlloc",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                ,0x58,"void Aig_ObjCreateRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_ObjCreateRepr( Aig_Man_t * p, Aig_Obj_t * pNode1, Aig_Obj_t * pNode2 )
{
    assert( p->pReprs != NULL );
    assert( !Aig_IsComplement(pNode1) );
    assert( !Aig_IsComplement(pNode2) );
    assert( pNode1->Id < p->nReprsAlloc );
    assert( pNode2->Id < p->nReprsAlloc );
    assert( pNode1->Id < pNode2->Id );
    p->pReprs[pNode2->Id] = pNode1;
}